

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_connection.c
# Opt level: O0

int mm_connection_close(mm_connection_t *connection)

{
  mm_connection_t *connection_local;
  
  close_serial((connection->proto).serial_context);
  (connection->proto).serial_context = (mm_serial_context *)0x0;
  if (connection->bytestream != (FILE *)0x0) {
    fclose((FILE *)connection->bytestream);
  }
  if (connection->logstream != (FILE *)0x0) {
    fclose((FILE *)connection->logstream);
  }
  if ((connection->proto).pcapstream != (FILE *)0x0) {
    mm_close_pcap((connection->proto).pcapstream);
  }
  if ((connection->proto).send_udp != '\0') {
    mm_close_udp();
  }
  return 0;
}

Assistant:

int mm_connection_close(mm_connection_t* connection) {
    close_serial(connection->proto.serial_context);
    connection->proto.serial_context = NULL;

    if (connection->bytestream) {
        fclose(connection->bytestream);
    }

    if (connection->logstream) {
        fclose(connection->logstream);
    }

    if (connection->proto.pcapstream) {
        mm_close_pcap(connection->proto.pcapstream);
    }

    if (connection->proto.send_udp) {
        mm_close_udp();
    }

    return (0);
}